

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupDfs(Aig_Man_t *p)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  Aig_Man_t *pNew;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int *__dest;
  Aig_Obj_t **ppAVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *pAVar11;
  ulong uVar12;
  Tim_Man_t *pTVar13;
  long lVar14;
  
  pNew = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  pNew->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  pNew->pSpec = pcVar7;
  iVar5 = p->nConstrs;
  pNew->nAsserts = p->nAsserts;
  pNew->nConstrs = iVar5;
  pNew->nBarBufs = p->nBarBufs;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    iVar5 = pVVar2->nSize;
    pVVar8->nSize = iVar5;
    pVVar8->nCap = iVar5;
    if ((long)iVar5 == 0) {
      sVar6 = 0;
      __dest = (int *)0x0;
    }
    else {
      sVar6 = (long)iVar5 << 2;
      __dest = (int *)malloc(sVar6);
    }
    pVVar8->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,sVar6);
    pNew->vFlopNums = pVVar8;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    ppAVar9 = (Aig_Obj_t **)calloc((long)p->vObjs->nSize,8);
    pNew->pEquivs = ppAVar9;
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    ppAVar9 = (Aig_Obj_t **)calloc((long)p->vObjs->nSize,8);
    pNew->pReprs = ppAVar9;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  pVVar10 = p->vObjs;
  if (0 < pVVar10->nSize) {
    lVar14 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar14];
      if (pvVar3 != (void *)0x0) {
        uVar4 = (uint)*(undefined8 *)((long)pvVar3 + 0x18) & 7;
        if (uVar4 == 3) {
          Aig_ManDupDfs_rec(pNew,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe))
          ;
          if (((ulong)pvVar3 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar12 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar12 == 0) {
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar11 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar12 + 0x28));
          }
          pAVar11 = Aig_ObjCreateCo(pNew,pAVar11);
        }
        else {
          if (uVar4 != 2) goto LAB_006c225e;
          pAVar11 = Aig_ObjCreateCi(pNew);
          *(ulong *)&pAVar11->field_0x18 =
               *(ulong *)&pAVar11->field_0x18 & 0xff000000ffffffff |
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffff00000000;
        }
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar11;
      }
LAB_006c225e:
      lVar14 = lVar14 + 1;
      pVVar10 = p->vObjs;
    } while (lVar14 < pVVar10->nSize);
  }
  if (p->pEquivs == (Aig_Obj_t **)0x0) {
    if ((p->nObjs[4] == 0) && (p->nObjs[6] + p->nObjs[5] != pNew->nObjs[6] + pNew->nObjs[5])) {
      __assert_fail("p->pEquivs != NULL || Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                    ,0x25a,"Aig_Man_t *Aig_ManDupDfs(Aig_Man_t *)");
    }
    if (p->pReprs == (Aig_Obj_t **)0x0) {
      uVar4 = Aig_ManCleanup(pNew);
      if (uVar4 != 0) {
        printf("Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar4);
      }
    }
  }
  Aig_ManSetRegNum(pNew,p->nRegs);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pTVar13 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    pNew->pManTime = pTVar13;
  }
  iVar5 = Aig_ManCheck(pNew);
  if (iVar5 == 0) {
    puts("Aig_ManDupDfs(): The check has failed.");
  }
  return pNew;
}

Assistant:

Aig_Man_t * Aig_ManDupDfs( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
        pNew->pEquivs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    if ( p->pReprs )
        pNew->pReprs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            Aig_ManDupDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );        
//            assert( pObj->Level == ((Aig_Obj_t*)pObj->pData)->Level );
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
            pObj->pData = pObjNew;
        }
    }
    assert( p->pEquivs != NULL || Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( p->pEquivs == NULL && p->pReprs == NULL && (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupDfs(): The check has failed.\n" );
    return pNew;
}